

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O1

void __thiscall pg::DTLSolver::search_rec(DTLSolver *this,bitset *R,int player,int depth)

{
  uint uVar1;
  Game *pGVar2;
  uint *puVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  ostream *poVar9;
  undefined4 in_register_0000000c;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  uint *puVar16;
  uint64_t *puVar17;
  char cVar18;
  bitset Z;
  bitset X;
  bitset V;
  _label_vertex local_c8;
  bitset local_b8;
  bitset local_98;
  uint64_t *local_78;
  int local_70;
  int local_6c;
  bitset local_68;
  undefined8 local_48;
  uint *local_40;
  bitset *local_38;
  
  local_48 = CONCAT44(in_register_0000000c,depth);
  pGVar2 = (this->super_Solver).game;
  local_98._size = pGVar2->n_vertices;
  uVar15 = local_98._size + 0x3f;
  local_98._bitssize = uVar15 >> 6;
  uVar11 = local_98._bitssize << 3;
  local_98._allocsize = uVar11;
  local_98._bits = (uint64_t *)operator_new__(uVar11);
  if (0x3f < uVar15) {
    memset(local_98._bits,0,uVar11);
  }
  local_68._size = pGVar2->n_vertices;
  uVar15 = local_68._size + 0x3f;
  local_68._bitssize = uVar15 >> 6;
  uVar11 = local_68._bitssize << 3;
  local_68._allocsize = uVar11;
  local_68._bits = (uint64_t *)operator_new__(uVar11);
  if (0x3f < uVar15) {
    memset(local_68._bits,0,uVar11);
  }
  local_b8._size = pGVar2->n_vertices;
  uVar15 = local_b8._size + 0x3f;
  local_b8._bitssize = uVar15 >> 6;
  uVar11 = local_b8._bitssize << 3;
  local_b8._allocsize = uVar11;
  local_b8._bits = (uint64_t *)operator_new__(uVar11);
  if (0x3f < uVar15) {
    memset(local_b8._bits,0,uVar11);
  }
  if (1 < (this->super_Solver).trace) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_Solver).logger,"\x1b[1;38;5;202mcurrent region:\x1b[m",0x1f);
    for (sVar8 = bitset::find_first(R); sVar8 != 0xffffffffffffffff;
        sVar8 = bitset::find_next(R,sVar8)) {
      poVar9 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[1;38;5;15m",0xd);
      local_c8.g = (this->super_Solver).game;
      local_c8.v = (int)sVar8;
      poVar9 = operator<<(poVar9,&local_c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
    }
    poVar9 = (this->super_Solver).logger;
    cVar18 = (char)poVar9;
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar18);
    std::ostream::put(cVar18);
    std::ostream::flush();
  }
  local_6c = 1 - player;
  local_70 = (int)local_48 + 1;
  local_38 = &this->W;
  do {
    if (local_68._bitssize != 0) {
      memset(local_68._bits,0,local_68._bitssize << 3);
    }
    iVar6 = best_vertices(this,&local_68,R,player);
    if (iVar6 == 0) {
      iVar6 = 1;
    }
    else {
      if (0 < (this->super_Solver).trace) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_Solver).logger,"\x1b[1;38;5;202mbest vertices:\x1b[m",0x1e);
        for (sVar8 = bitset::find_first(&local_68); sVar8 != 0xffffffffffffffff;
            sVar8 = bitset::find_next(&local_68,sVar8)) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[1;38;5;15m",0xd);
          local_c8.g = (this->super_Solver).game;
          local_c8.v = (int)sVar8;
          poVar9 = operator<<(poVar9,&local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
        }
        if (iVar6 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->super_Solver).logger," (stable)",9);
        }
        poVar9 = (this->super_Solver).logger;
        cVar18 = (char)poVar9;
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar18);
        std::ostream::put(cVar18);
        std::ostream::flush();
      }
      if (iVar6 == 1) {
        do {
          bitset::operator=(&local_b8,R);
          this->cur_depth = (int)local_48;
          bVar5 = sptl(this,&local_68,local_38,&local_b8,player);
        } while (bVar5);
        if (local_b8._bitssize != 0) {
          memset(local_b8._bits,0,local_b8._bitssize << 3);
        }
        uVar7 = (int)((this->super_Solver).game)->n_vertices - 1;
        iVar6 = 5;
        if (-1 < (int)uVar7) {
          uVar11 = (ulong)uVar7;
          do {
            uVar15 = uVar11 >> 6;
            if ((local_68._bits[uVar15] >> (uVar11 & 0x3f) & 1) != 0) {
              uVar10 = 1L << (uVar11 & 0x3f);
              if ((local_98._bits[uVar15] & uVar10) == 0) {
                local_98._bits[uVar15] = local_98._bits[uVar15] | uVar10;
                this->str[uVar11] = -1;
                iVar6 = (this->Q).pointer;
                (this->Q).pointer = iVar6 + 1;
                (this->Q).queue[iVar6] = (uint)uVar11;
                iVar6 = (this->Q).pointer;
                while (iVar6 != 0) {
                  (this->Q).pointer = iVar6 + -1;
                  uVar1 = (this->Q).queue[(long)iVar6 + -1];
                  uVar15 = (ulong)(int)uVar1;
                  bVar4 = (byte)uVar1 & 0x3f;
                  R->_bits[uVar15 >> 6] =
                       R->_bits[uVar15 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                  attractVertices(this,player,uVar1,R,&local_98,R,
                                  ((this->super_Solver).game)->_priority[uVar11]);
                  piVar12 = this->tin[uVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar13 = this->tin[uVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  if (piVar12 != piVar13) {
                    iVar6 = ((this->super_Solver).game)->_priority[uVar11];
                    do {
                      attractTangle(this,*piVar12,player,R,&local_98,R,iVar6);
                      piVar12 = piVar12 + 1;
                    } while (piVar12 != piVar13);
                  }
                  iVar6 = (this->Q).pointer;
                }
              }
            }
            bVar5 = 0 < (long)uVar11;
            uVar11 = uVar11 - 1;
          } while (bVar5);
          iVar6 = 5;
        }
      }
      else {
        pGVar2 = (this->super_Solver).game;
        if (pGVar2->n_vertices < 1) {
          iVar6 = 0;
        }
        else {
          puVar17 = R->_bits;
          local_78 = local_b8._bits;
          local_40 = (this->Q).queue;
          piVar12 = this->str;
          uVar11 = 0;
          iVar6 = 0;
          do {
            uVar15 = uVar11 >> 6;
            if ((puVar17[uVar15] >> (uVar11 & 0x3f) & 1) != 0) {
              iVar14 = iVar6;
              if ((iVar6 < pGVar2->_priority[uVar11]) &&
                 (iVar14 = pGVar2->_priority[uVar11], (this->Q).pointer != 0)) break;
              iVar6 = iVar14;
              if ((uint)(((pGVar2->_owner)._bits[uVar15] >> (uVar11 & 0x3f) & 1) != 0) == player) {
                uVar10 = (ulong)pGVar2->_outedges[pGVar2->_firstouts[uVar11]];
                bVar5 = uVar10 != 0xffffffffffffffff;
                if (uVar10 == 0xffffffffffffffff) {
LAB_00177346:
                  if (!bVar5) goto LAB_00177383;
                }
                else if ((local_98._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) {
                  piVar13 = pGVar2->_outedges + (long)pGVar2->_firstouts[uVar11] + 1;
                  do {
                    uVar10 = (ulong)*piVar13;
                    bVar5 = uVar10 != 0xffffffffffffffff;
                    if (uVar10 == 0xffffffffffffffff) break;
                    piVar13 = piVar13 + 1;
                  } while ((local_98._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0);
                  goto LAB_00177346;
                }
                local_b8._bits[uVar15] = local_b8._bits[uVar15] | 1L << (uVar11 & 0x3f);
                piVar12[uVar11] = -1;
                iVar14 = (this->Q).pointer;
                (this->Q).pointer = iVar14 + 1;
                local_40[iVar14] = (uint)uVar11;
              }
              else {
                uVar7 = pGVar2->_outedges[pGVar2->_firstouts[uVar11]];
                if (uVar7 != 0xffffffff) {
                  puVar16 = (uint *)(pGVar2->_outedges + (long)pGVar2->_firstouts[uVar11] + 1);
                  bVar5 = false;
                  bVar4 = 0;
                  do {
                    if ((local_98._bits[(ulong)(long)(int)uVar7 >> 6] >> ((ulong)uVar7 & 0x3f) & 1)
                        == 0) {
                      cVar18 = (puVar17[(ulong)(long)(int)uVar7 >> 6] & 1L << ((ulong)uVar7 & 0x3f))
                               != 0;
                    }
                    else {
                      bVar4 = 1;
                      cVar18 = '\a';
                    }
                    if ((cVar18 != '\a') && (cVar18 != '\0')) break;
                    uVar7 = *puVar16;
                    puVar16 = puVar16 + 1;
                    bVar5 = uVar7 == 0xffffffff;
                  } while (!bVar5);
                  bVar5 = (bool)(bVar5 & bVar4);
                  goto LAB_00177346;
                }
              }
            }
LAB_00177383:
            uVar11 = uVar11 + 1;
          } while ((long)uVar11 < pGVar2->n_vertices);
        }
        if ((this->Q).pointer == 0) {
          if (1 < (this->super_Solver).trace) {
            poVar9 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,anon_var_dwarf_28e1cd,0xd);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
          }
          iVar6 = 0;
          uVar7 = (int)((this->super_Solver).game)->n_vertices - 1;
          if ((int)uVar7 < 0) goto LAB_00177954;
          puVar17 = (uint64_t *)(ulong)uVar7;
          do {
            uVar11 = (ulong)puVar17 >> 6;
            if ((local_68._bits[uVar11] >> ((ulong)puVar17 & 0x3f) & 1) != 0) {
              uVar15 = 1L << ((ulong)puVar17 & 0x3f);
              if ((local_98._bits[uVar11] & uVar15) == 0) {
                local_98._bits[uVar11] = local_98._bits[uVar11] | uVar15;
                this->str[(long)puVar17] = -1;
                iVar6 = (this->Q).pointer;
                (this->Q).pointer = iVar6 + 1;
                (this->Q).queue[iVar6] = (uint)puVar17;
                iVar6 = (this->Q).pointer;
                while (iVar6 != 0) {
                  (this->Q).pointer = iVar6 + -1;
                  uVar1 = (this->Q).queue[(long)iVar6 + -1];
                  uVar11 = (ulong)(int)uVar1;
                  bVar4 = (byte)uVar1 & 0x3f;
                  R->_bits[uVar11 >> 6] =
                       R->_bits[uVar11 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                  if (2 < (this->super_Solver).trace) {
                    iVar6 = (this->Zvec).pointer;
                    (this->Zvec).pointer = iVar6 + 1;
                    (this->Zvec).queue[iVar6] = uVar1;
                  }
                  attractVertices(this,player,uVar1,R,&local_98,R,
                                  ((this->super_Solver).game)->_priority[(long)puVar17]);
                  piVar12 = this->tin[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar13 = this->tin[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  if (piVar12 != piVar13) {
                    iVar6 = ((this->super_Solver).game)->_priority[(long)puVar17];
                    do {
                      attractTangle(this,*piVar12,player,R,&local_98,R,iVar6);
                      piVar12 = piVar12 + 1;
                    } while (piVar12 != piVar13);
                  }
                  iVar6 = (this->Q).pointer;
                }
                if (1 < (this->super_Solver).trace) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m ",0x11);
                  poVar9 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;36m",7);
                  poVar9 = (ostream *)
                           std::ostream::operator<<
                                     (poVar9,((this->super_Solver).game)->_priority[(long)puVar17]);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                  local_78 = puVar17;
                  if ((this->Zvec).pointer != 0) {
                    uVar11 = 0;
                    do {
                      poVar9 = (this->super_Solver).logger;
                      uVar1 = (this->Zvec).queue[uVar11];
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9," \x1b[1;38;5;15m",0xd);
                      local_c8.g = (this->super_Solver).game;
                      local_c8.v = uVar1;
                      poVar9 = operator<<(poVar9,&local_c8);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                      if (this->str[(int)uVar1] != -1) {
                        poVar9 = (this->super_Solver).logger;
                        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"->",2);
                        local_c8.g = (this->super_Solver).game;
                        local_c8.v = this->str[(int)uVar1];
                        operator<<(poVar9,&local_c8);
                      }
                      uVar11 = uVar11 + 1;
                    } while (uVar11 < (uint)(this->Zvec).pointer);
                  }
                  poVar9 = (this->super_Solver).logger;
                  cVar18 = (char)poVar9;
                  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar18);
                  puVar17 = local_78;
                  std::ostream::put(cVar18);
                  std::ostream::flush();
                  (this->Zvec).pointer = 0;
                }
              }
            }
            bVar5 = 0 < (long)puVar17;
            puVar17 = (uint64_t *)((long)puVar17 + -1);
          } while (bVar5);
        }
        else {
          while (iVar14 = (this->Q).pointer, iVar14 != 0) {
            (this->Q).pointer = iVar14 + -1;
            uVar1 = (this->Q).queue[(long)iVar14 + -1];
            uVar11 = (ulong)(int)uVar1;
            bVar4 = (byte)uVar1 & 0x3f;
            R->_bits[uVar11 >> 6] =
                 R->_bits[uVar11 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
            attractVertices(this,player,uVar1,R,&local_b8,R,iVar6);
            piVar13 = this->tin[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            for (piVar12 = this->tin[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar12 != piVar13;
                piVar12 = piVar12 + 1) {
              attractTangle(this,*piVar12,player,R,&local_b8,R,iVar6);
            }
          }
          if (1 < (this->super_Solver).trace) {
            poVar9 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,anon_var_dwarf_28e1b5,0x20);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\x1b[m",4);
            for (sVar8 = bitset::find_first(&local_b8); sVar8 != 0xffffffffffffffff;
                sVar8 = bitset::find_next(&local_b8,sVar8)) {
              poVar9 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[1;38;5;15m",0xd);
              local_c8.g = (this->super_Solver).game;
              local_c8.v = (int)sVar8;
              poVar9 = operator<<(poVar9,&local_c8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
            }
            poVar9 = (this->super_Solver).logger;
            cVar18 = (char)poVar9;
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar18);
            std::ostream::put(cVar18);
            std::ostream::flush();
          }
          pGVar2 = (this->super_Solver).game;
          uVar7 = (uint)pGVar2->n_vertices;
          uVar11 = (ulong)uVar7;
          if (-1 < (int)(uVar7 - 1)) {
            piVar12 = pGVar2->_priority;
            puVar3 = (this->Q).queue;
            do {
              uVar7 = (int)uVar11 - 1;
              uVar11 = (ulong)uVar7;
              iVar14 = piVar12[uVar11];
              if (iVar14 < iVar6) break;
              if (((local_b8._bits[uVar7 >> 6] >> (uVar11 & 0x3f) & 1) != 0) && (iVar14 == iVar6)) {
                local_98._bits[uVar7 >> 6] = local_98._bits[uVar7 >> 6] | 1L << (uVar11 & 0x3f);
                iVar14 = (this->Q).pointer;
                (this->Q).pointer = iVar14 + 1;
                puVar3[iVar14] = uVar7;
              }
            } while (0 < (int)uVar7);
          }
          while( true ) {
            iVar14 = (this->Q).pointer;
            if ((long)iVar14 == 0) break;
            (this->Q).pointer = iVar14 + -1;
            uVar1 = (this->Q).queue[(long)iVar14 + -1];
            bVar4 = (byte)uVar1 & 0x3f;
            local_b8._bits[(ulong)(long)(int)uVar1 >> 6] =
                 local_b8._bits[(ulong)(long)(int)uVar1 >> 6] &
                 (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
            attractVertices(this,local_6c,uVar1,&local_b8,&local_98,&local_b8,iVar6);
          }
          if (local_98._bitssize != 0) {
            uVar11 = 0;
            do {
              local_98._bits[uVar11] = local_98._bits[uVar11] | local_b8._bits[uVar11];
              uVar11 = uVar11 + 1;
            } while (local_98._bitssize != uVar11);
          }
          search_rec(this,&local_b8,player,local_70);
          if (local_b8._bitssize != 0) {
            memset(local_b8._bits,0,local_b8._bitssize << 3);
          }
        }
        iVar6 = 0;
      }
    }
LAB_00177954:
    if ((iVar6 != 0) && (iVar6 != 5)) {
      if (local_b8._bits != (uint64_t *)0x0) {
        operator_delete__(local_b8._bits);
      }
      if (local_68._bits != (uint64_t *)0x0) {
        operator_delete__(local_68._bits);
      }
      if (local_98._bits != (uint64_t *)0x0) {
        operator_delete__(local_98._bits);
      }
      return;
    }
  } while( true );
}

Assistant:

void
DTLSolver::search_rec(bitset &R, const int player, const int depth)
{
    bitset X(nodecount()); // vertices removed from R
    bitset V(nodecount()); // the best vertices each iteration
    bitset Z(nodecount()); // holds various subregions
    bitset Z2(nodecount()); // holds various subregions

    if (trace >= 2) {
        logger << "\033[1;38;5;202mcurrent region:\033[m";
        for (auto v = R.find_first(); v != bitset::npos; v = R.find_next(v)) {
            logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
        }
        logger << std::endl;
    }

    while (true) {
        // Compute the best vertices V
        V.reset();
        int result = best_vertices(V, R, player);
        if (result == 0) return; // done

        if (trace >= 1) {
            logger << "\033[1;38;5;202mbest vertices:\033[m";
            for (auto v = V.find_first(); v != bitset::npos; v = V.find_next(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
            }
            if (result == 1) logger << " (stable)";
            logger << std::endl;
        }

        // If the best vertices are stable, run SPTL to learn local dominions and add them to X

        if (result == 1) {
            // Run SPTL for a while
            bool more = true;
            while (more) {
                Z = R;
                cur_depth = depth;
                more = sptl(V, W, Z, player);
            }
            Z.reset();

            // Add Dom(V,R) to X
            for (int top=nodecount()-1; top>=0; top--) {
                if (V[top] and !X[top]) {
                    X[top] = true; // add to <X>
                    str[top] = -1;
                    Q.push(top);
                    while (Q.nonempty()) {
                        const int v = Q.pop();
                        R[v] = false;
                        attractVertices(player, v, R, X, R, priority(top));
                        attractTangles(player, v, R, X, R, priority(top));
                    }
                }
            }

            continue;
        }

        // If the best vertices are not stable, first try to attract to X.
        // Find the lowest threshold to attract to X.

        int t = 0; // initial threshold
        for (int v=0; v<nodecount(); v++) {
            if (R[v]) {
                if (priority(v) > t) {
                    if (Q.nonempty()) break;
                    // update threshold
                    t = priority(v);
                }
                if (attracts(player, v, X, R)) {
                    Z[v] = true;
                    str[v] = -1;
                    Q.push(v);
                }
            }
        }

        if (Q.nonempty()) {
            // Apparently, we found the lowest threshold t, they are in Z
            // Now attract with threshold t from R to Z

            while (Q.nonempty()) {
                const int u = Q.pop();
                R[u] = false;
                attractVertices(player, u, R, Z, R, t);
                attractTangles(player, u, R, Z, R, t);
            }

#ifndef NDEBUG
            if (trace >= 2) {
                logger << "X ∪= attracted with threshold " << t << ":\033[m";
                for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) {
                    logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                }
                logger << std::endl;
            }
#endif

            // Now remove the attractor to threshold vertices from Z (by moving them to X)
            for (int u=nodecount()-1; u >= 0; u--) {
                if (priority(u) < t) break; // done
                if (Z[u] and priority(u) == t) {
                    X[u] = true;
                    Q.push(u);
                }
            }

            while (Q.nonempty()) {
                const int u = Q.pop();
                Z[u] = false;
                attractVertices(1-player, u, Z, X, Z, t);
            }

            // And add all vertices in Z also to X
            X |= Z;

            // Recursively Z
            /*if (depth == 0)*/ search_rec(Z, player, depth+1);
            Z.reset();
        } else {
#ifndef NDEBUG
            if (trace >= 2) logger << "X ∪= Dom(V)" << std::endl;
#endif

            // Add Dom(V,R) to X
            for (int top=nodecount()-1; top>=0; top--) {
                if (V[top] and !X[top]) {
                    X[top] = true; // add to <X>
                    str[top] = -1;
                    Q.push(top);
                    while (Q.nonempty()) {
                        const int v = Q.pop();
                        R[v] = false;
#ifndef NDEBUG
                        if (trace >= 3) Zvec.push(v);
#endif
                        attractVertices(player, v, R, X, R, priority(top));
                        attractTangles(player, v, R, X, R, priority(top));
                    }
#ifndef NDEBUG
                    if (trace >= 2) {
                        // report region
                        logger << "\033[1;33mregion\033[m ";
                        logger << "\033[1;36m" << priority(top) << "\033[m";
                        for (unsigned int i=0; i<Zvec.size(); i++) {
                            int v = Zvec[i];
                            logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                            if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                        }
                        logger << std::endl;
                        Zvec.clear();
                    }
#endif
                }
            }
        }
    }
}